

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

int map_set(pMap map,size_t key,void *value)

{
  ulong uVar1;
  size_t sVar2;
  long lVar3;
  size_t *psVar4;
  void *pvVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar1 = map->count;
  bVar8 = uVar1 != 0;
  if (bVar8) {
    if (*map->keys == key) {
      uVar7 = 0;
    }
    else {
      uVar6 = 0;
      do {
        if (uVar1 - 1 == uVar6) goto LAB_00103ec5;
        uVar7 = uVar6 + 1;
        lVar3 = uVar6 + 1;
        uVar6 = uVar7;
      } while (map->keys[lVar3] != key);
      bVar8 = uVar7 < uVar1;
    }
    memcpy((void *)(uVar7 * map->value_size + (long)map->values),value,map->value_size);
    if (bVar8) {
      return 1;
    }
  }
LAB_00103ec5:
  sVar2 = map->count;
  psVar4 = (size_t *)realloc(map->keys,sVar2 * 8 + 8);
  if (psVar4 != (size_t *)0x0) {
    pvVar5 = realloc(map->values,map->value_size * (sVar2 + 1));
    if (pvVar5 != (void *)0x0) {
      psVar4[sVar2] = key;
      memcpy((void *)(sVar2 * map->value_size + (long)pvVar5),value,map->value_size);
      map->count = sVar2 + 1;
      map->keys = psVar4;
      map->values = pvVar5;
      return 0;
    }
  }
  perror("map_set: realloc failed");
  return -1;
}

Assistant:

int map_set(pMap map, size_t key, void *value)
{
    for (int i = 0; i < map->count; i++)
    {
        if (map->keys[i] == key)
        {
            memcpy(map->values + i * map->value_size, value, map->value_size);
            return MAP_EXISTS;
        }
    }
    size_t index = map->count;
    size_t count = index + 1;
    size_t *keys = realloc(map->keys, count * sizeof(size_t));
    if (keys == NULL)
    {
        perror("map_set: realloc failed");
        return MAP_FAILED;
    }

    void *values = realloc(map->values, count * map->value_size);
    if (values == NULL)
    {
        perror("map_set: realloc failed");
        return MAP_FAILED;
    }
    keys[index] = key;
    memcpy(values + index * map->value_size, value, map->value_size);

    map->count = count;
    map->keys = keys;
    map->values = values;
    return MAP_SUCCESS;
}